

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.cpp
# Opt level: O0

bool __thiscall Clasp::Lookahead::test(Lookahead *this,Solver *s,Literal p)

{
  bool bVar1;
  Var VVar2;
  reference pVVar3;
  Literal in_EDX;
  PostPropagator *in_RSI;
  Solver *in_RDI;
  Literal unaff_retaddr;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  PostPropagator *in_stack_ffffffffffffffa0;
  Literal p_00;
  Solver *in_stack_ffffffffffffffa8;
  Solver *this_00;
  Literal in_stack_ffffffffffffffb0;
  Literal p_01;
  bool local_41;
  Solver *s_00;
  undefined4 in_stack_fffffffffffffff8;
  
  s_00 = in_RDI;
  VVar2 = Literal::var((Literal *)&stack0xfffffffffffffffc);
  bk_lib::pod_vector<Clasp::VarScore,_std::allocator<Clasp::VarScore>_>::operator[]
            ((pod_vector<Clasp::VarScore,_std::allocator<Clasp::VarScore>_> *)
             &(in_RDI->model).ebo_.size,VVar2);
  bVar1 = VarScore::seen((VarScore *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                         (Literal)(uint32)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  if ((!bVar1) &&
     (bVar1 = Solver::test(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,
                           in_stack_ffffffffffffffa0), !bVar1)) {
    return false;
  }
  p_00.rep_ = (uint32)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  bVar1 = Literal::flagged((Literal *)&stack0xfffffffffffffffc);
  if (bVar1) {
    this_00 = (Solver *)&(in_RDI->model).ebo_.size;
    VVar2 = Literal::var((Literal *)&stack0xfffffffffffffffc);
    pVVar3 = bk_lib::pod_vector<Clasp::VarScore,_std::allocator<Clasp::VarScore>_>::operator[]
                       ((pod_vector<Clasp::VarScore,_std::allocator<Clasp::VarScore>_> *)this_00,
                        VVar2);
    p_01.rep_ = (uint32)pVVar3;
    Literal::operator~((Literal *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    bVar1 = VarScore::seen((VarScore *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)
                           ,p_00);
    if (!bVar1) {
      Literal::operator~((Literal *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      bVar1 = Solver::test(this_00,p_01,in_RSI);
      if (!bVar1) {
        return false;
      }
    }
  }
  bVar1 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::empty
                    ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)&in_RDI->shared_
                    );
  local_41 = true;
  if (!bVar1) {
    local_41 = checkImps((Lookahead *)CONCAT44(in_EDX.rep_,in_stack_fffffffffffffff8),s_00,
                         unaff_retaddr);
  }
  return local_41;
}

Assistant:

bool Lookahead::test(Solver& s, Literal p) {
	return (score.score[p.var()].seen(p) || s.test(p, this))
		&& (!p.flagged() || score.score[p.var()].seen(~p) || s.test(~p, this))
		&& (imps_.empty() || checkImps(s, p));
}